

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_query.cpp
# Opt level: O1

uint32_t spvtools::val::anon_unknown_2::GetArrayLength(ValidationState_t *_,Instruction *array_type)

{
  uint uVar1;
  Instruction *this;
  
  if ((array_type->inst_).opcode != 0x1c) {
    __assert_fail("array_type->opcode() == spv::Op::OpTypeArray",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_ray_query.cpp"
                  ,0x1b,
                  "uint32_t spvtools::val::(anonymous namespace)::GetArrayLength(ValidationState_t &, const Instruction *)"
                 );
  }
  uVar1 = Instruction::GetOperandAs<unsigned_int>(array_type,2);
  this = ValidationState_t::FindDef(_,uVar1);
  if ((this->inst_).opcode == 0x2b) {
    uVar1 = Instruction::GetOperandAs<unsigned_int>(this,2);
    return uVar1;
  }
  return 0;
}

Assistant:

uint32_t GetArrayLength(ValidationState_t& _, const Instruction* array_type) {
  assert(array_type->opcode() == spv::Op::OpTypeArray);
  uint32_t const_int_id = array_type->GetOperandAs<uint32_t>(2U);
  Instruction* array_length_inst = _.FindDef(const_int_id);
  uint32_t array_length = 0;
  if (array_length_inst->opcode() == spv::Op::OpConstant) {
    array_length = array_length_inst->GetOperandAs<uint32_t>(2);
  }
  return array_length;
}